

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_find.c
# Opt level: O0

void * mpt_queue_find(mpt_queue *queue,size_t esz,_func_int_void_ptr_void_ptr *cmp,void *carg)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  void *local_48;
  char *addr;
  size_t iter;
  size_t pos;
  void *carg_local;
  _func_int_void_ptr_void_ptr *cmp_local;
  size_t esz_local;
  mpt_queue *queue_local;
  
  if ((queue == (mpt_queue *)0x0) || (cmp == (_func_int_void_ptr_void_ptr *)0x0)) {
    piVar4 = __errno_location();
    *piVar4 = 0xe;
  }
  else if (queue->len < esz) {
    piVar4 = __errno_location();
    *piVar4 = 0xb;
  }
  else {
    local_48 = (void *)(queue->off + (long)queue->base);
    if (queue->max - queue->len < queue->off) {
      sVar1 = queue->max;
      sVar2 = queue->off;
      for (iter = 0; iter < (sVar1 - sVar2) / esz; iter = iter + 1) {
        iVar3 = (*cmp)(local_48,carg);
        if (iVar3 == 0) {
          return local_48;
        }
        local_48 = (void *)((long)local_48 + esz);
      }
      uVar5 = queue->max - queue->off;
      if (uVar5 % esz != 0) {
        piVar4 = __errno_location();
        *piVar4 = 0x5f;
        return (void *)0x0;
      }
      uVar5 = queue->len - uVar5;
      local_48 = queue->base;
    }
    else {
      uVar5 = queue->len;
    }
    addr = (char *)(uVar5 / esz);
    for (iter = 0; iter < addr; iter = iter + 1) {
      iVar3 = (*cmp)(local_48,carg);
      if (iVar3 == 0) {
        return local_48;
      }
      local_48 = (void *)((long)local_48 + esz);
    }
  }
  return (void *)0x0;
}

Assistant:

extern void *mpt_queue_find(const MPT_STRUCT(queue) *queue, size_t esz, int (*cmp)(const void *, void *), void *carg)
{
	size_t pos, iter;
	char *addr;
	
	if (!queue || !cmp) {
		errno = EFAULT;
		return 0;
	}
	
	addr = queue->base;
	
	if (queue->len < esz) {
		errno = EAGAIN;
		return 0;
	}
	
	addr += queue->off;
	
	/* queue is aligned */
	if (!MPT_queue_frag(queue)) {
		iter = queue->len/esz;
	}
	else {
		/* elements in upper data part */
		iter = (queue->max - queue->off)/esz;
		
		for (pos = 0; pos < iter; pos++, addr += esz) {
			if (!cmp(addr, carg)) {
				return addr;
			}
		}
		iter = queue->max - queue->off;
		
		/* element wrapping over queue border */
		if (iter % esz) {
			errno = ENOTSUP;
			return 0;
		}
		/* remaining elements in lower data part */
		iter = (queue->len - iter)/esz;
		addr = queue->base;
	}
	
	for (pos = 0; pos < iter; pos++, addr += esz) {
		if (!cmp(addr, carg)) {
			return addr;
		}
	}
	
	return 0;
}